

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::parse(Reader *this,string *document,Value *root,bool collectComments)

{
  pointer pcVar1;
  char *beginDoc;
  bool bVar2;
  size_type sVar3;
  string documentCopy;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar1 = (document->_M_dataplus)._M_p;
  sVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &document->field_2) {
    sVar3 = (document->field_2)._M_allocated_capacity;
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar1,pcVar1 + sVar3);
  std::__cxx11::string::swap((string *)local_48);
  beginDoc = (this->document_)._M_dataplus._M_p;
  bVar2 = parse(this,beginDoc,beginDoc + (this->document_)._M_string_length,root,collectComments);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return bVar2;
}

Assistant:

bool
Reader::parse(const std::string& document, Value& root, bool collectComments) {
  JSONCPP_STRING documentCopy(document.data(), document.data() + document.capacity());
  std::swap(documentCopy, document_);
  const char* begin = document_.c_str();
  const char* end = begin + document_.length();
  return parse(begin, end, root, collectComments);
}